

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void MirrorSplitUVRow_C(uint8_t *src_uv,uint8_t *dst_u,uint8_t *dst_v,int width)

{
  int x;
  int width_local;
  uint8_t *dst_v_local;
  uint8_t *dst_u_local;
  uint8_t *src_uv_local;
  
  src_uv_local = src_uv + (width + -1) * 2;
  for (x = 0; x < width + -1; x = x + 2) {
    dst_u[x] = *src_uv_local;
    dst_u[x + 1] = src_uv_local[-2];
    dst_v[x] = src_uv_local[1];
    dst_v[x + 1] = src_uv_local[-1];
    src_uv_local = src_uv_local + -4;
  }
  if ((width & 1U) != 0) {
    dst_u[width + -1] = *src_uv_local;
    dst_v[width + -1] = src_uv_local[1];
  }
  return;
}

Assistant:

void MirrorSplitUVRow_C(const uint8_t* src_uv,
                        uint8_t* dst_u,
                        uint8_t* dst_v,
                        int width) {
  int x;
  src_uv += (width - 1) << 1;
  for (x = 0; x < width - 1; x += 2) {
    dst_u[x] = src_uv[0];
    dst_u[x + 1] = src_uv[-2];
    dst_v[x] = src_uv[1];
    dst_v[x + 1] = src_uv[-2 + 1];
    src_uv -= 4;
  }
  if (width & 1) {
    dst_u[width - 1] = src_uv[0];
    dst_v[width - 1] = src_uv[1];
  }
}